

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdInitializeTxDataHandle(void *handle,int net_type,char *tx_hex_string,void **tx_data_handle)

{
  bool bVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *buffer;
  int result;
  string *in_stack_fffffffffffffe08;
  ConfidentialTransactionContext *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe30;
  bool *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe74;
  allocator local_161;
  string local_160 [44];
  uint32_t in_stack_fffffffffffffecc;
  string *in_stack_fffffffffffffed0;
  allocator local_101;
  string local_100 [32];
  char *local_e0;
  undefined4 local_d8;
  char *local_d0;
  byte local_c3;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  void *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  char *local_20;
  undefined4 local_14;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_2c = 0xffffffff;
  local_38 = (void *)0x0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0xd7d;
    local_60.funcname = "CfdInitializeTxDataHandle";
    cfd::core::logger::warn<>(&local_60,"tx data handle is null.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx data handle is null.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe30,error_code,in_stack_fffffffffffffe20);
    local_82 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    local_c3 = 0;
    cfd::capi::ConvertNetType
              (CONCAT13(bVar1,(int3)in_stack_fffffffffffffe74),in_stack_fffffffffffffe68);
    if ((local_c3 & 1) == 0) {
      local_e0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                         ,0x2f);
      local_e0 = local_e0 + 1;
      local_d8 = 0xd8d;
      local_d0 = "CfdInitializeTxDataHandle";
      cfd::core::logger::info<int&>
                ((CfdSourceLocation *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
                 (int *)0x606560);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"TransactionData",&local_101);
    local_38 = cfd::capi::AllocBuffer(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    *(undefined4 *)((long)local_38 + 0x10) = local_14;
    if ((local_c3 & 1) == 0) {
      pvVar3 = operator_new(0xb8);
      paVar4 = &local_161;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,local_20,paVar4);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      *(void **)((long)local_38 + 0x18) = pvVar3;
    }
    else {
      pvVar3 = operator_new(0xb8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffed0,local_20,(allocator *)&stack0xfffffffffffffecf);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
      *(void **)((long)local_38 + 0x18) = pvVar3;
    }
    *local_28 = local_38;
    return 0;
  }
  local_a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_a0.filename = local_a0.filename + 1;
  local_a0.line = 0xd83;
  local_a0.funcname = "CfdInitializeTxDataHandle";
  cfd::core::logger::warn<>(&local_a0,"tx_hex is null or empty.");
  local_c2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  paVar4 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Failed to parameter. tx_hex is null or empty.",paVar4);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffe30,error_code,in_stack_fffffffffffffe20);
  local_c2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeTxDataHandle(
    void* handle, int net_type, const char* tx_hex_string,
    void** tx_data_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiTransactionData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (tx_data_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "tx data handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx data handle is null.");
    }
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (!is_bitcoin) {
#ifndef CFD_DISABLE_ELEMENTS
      info(CFD_LOG_SOURCE, "net_type[{}]", net_type);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    buffer = static_cast<CfdCapiTransactionData*>(
        AllocBuffer(kPrefixTransactionData, sizeof(CfdCapiTransactionData)));
    buffer->net_type = net_type;
    if (is_bitcoin) {
      TransactionContext* tx =
          new TransactionContext(std::string(tx_hex_string));
      buffer->tx_obj = tx;
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          new ConfidentialTransactionContext(std::string(tx_hex_string));
      buffer->tx_obj = tx;
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    *tx_data_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreeTxDataHandle(handle, buffer);
  return result;
}